

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_intarith(ASMState *as,IRIns *ir,x86Arith xa)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  MCode *pMVar6;
  Reg dest;
  int iVar7;
  uint uVar8;
  Reg rb;
  long *plVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  x86Op xVar13;
  uint uVar14;
  bool bVar15;
  int local_40;
  IRRef local_3c;
  
  uVar1 = (ir->field_0).op1;
  uVar2 = (ir->field_0).op2;
  uVar12 = (ulong)uVar2;
  pbVar5 = as->mcp;
  if (as->flagmcp == pbVar5) {
    bVar15 = *pbVar5 < 0x84;
    bVar10 = pbVar5[(ulong)bVar15 + 3] & 0xf;
    if (bVar10 < 0xe) {
      if (0xb < bVar10) {
        pbVar5[(ulong)bVar15 + 3] = pbVar5[(ulong)bVar15 + 3] - 4;
      }
      as->flagmcp = (MCode *)0x0;
      as->mcp = pbVar5 + (ulong)bVar15 + 2;
    }
  }
  bVar10 = *(byte *)((long)as->ir + uVar12 * 8 + 6);
  if ((char)bVar10 < '\0') {
    uVar14 = 0xffef;
  }
  else {
    uVar14 = ~(1 << (bVar10 & 0x1f)) & 0xffef;
    as->weakset = as->weakset & (-2 << (bVar10 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar10 & 0x1f));
  }
  dest = ra_dest(as,ir,uVar14);
  local_40 = 0;
  local_3c = (IRRef)uVar1;
  uVar8 = dest;
  if ((uVar1 != uVar2) && (uVar8 = (uint)bVar10, (char)bVar10 < '\0')) {
    if (((short)uVar2 < 0) ||
       ((plVar9 = (long *)(ulong)as->ir[uVar12].field_1.op12,
        *(char *)((long)as->ir + uVar12 * 8 + 5) == '\x1c' &&
        (plVar9 = (long *)*plVar9, (long *)(long)(int)plVar9 != plVar9)))) {
      iVar7 = asm_swapops(as,ir);
      uVar11 = (uint)uVar2;
      if (iVar7 == 0) {
        uVar11 = local_3c;
        local_3c = (uint)uVar2;
      }
      uVar8._0_2_ = *(IROpT *)((long)ir + 4);
      uVar8._2_2_ = *(IRRef1 *)((long)ir + 6);
      uVar8 = asm_fuseloadm(as,local_3c,uVar14 & ~(1 << (dest & 0x1f)),
                            (uint)((0x604208U >> (uVar8 & 0x1f) & 1) != 0));
      local_3c = uVar11;
    }
    else {
      local_40 = (int)plVar9;
      uVar8 = (uint)bVar10;
    }
  }
  if ((char)(ir->field_1).t.irt < '\0') {
    asm_guardcc(as,0);
  }
  if (xa == XOg_X_IMUL) {
    uVar3._0_2_ = *(IROpT *)((long)ir + 4);
    uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar11 = (uint)((0x604208U >> (uVar3 & 0x1f) & 1) != 0);
    if (0x7f < uVar8) {
      rb = asm_fuseloadm(as,local_3c,0xffef,uVar11);
      if ((char)(MCode)local_40 == local_40) {
        pMVar6 = as->mcp;
        as->mcp = pMVar6 + -1;
        pMVar6[-1] = (MCode)local_40;
        xVar13 = XO_IMULi8;
      }
      else {
        pMVar6 = as->mcp;
        *(int *)(pMVar6 + -4) = local_40;
        as->mcp = pMVar6 + -4;
        xVar13 = XO_IMULi;
      }
      uVar4._0_2_ = *(IROpT *)((long)ir + 4);
      uVar4._2_2_ = *(IRRef1 *)((long)ir + 6);
      emit_mrm(as,xVar13,-(uint)((0x604208U >> (uVar4 & 0x1f) & 1) != 0) & 0x80200 | dest,rb);
      return;
    }
    uVar14 = 0x80200;
    if (uVar11 == 0) {
      uVar14 = 0;
    }
    xVar13 = XO_IMUL;
  }
  else {
    if (0x7f < uVar8) {
      uVar14._0_2_ = *(IROpT *)((long)ir + 4);
      uVar14._2_2_ = *(IRRef1 *)((long)ir + 6);
      emit_gri(as,xa + 0x838100,-(uint)((0x604208U >> (uVar14 & 0x1f) & 1) != 0) & 0x80200 | dest,
               local_40);
      goto LAB_0013f070;
    }
    xVar13 = xa << 0x1b | 0x30000fe;
    uVar11._0_2_ = *(IROpT *)((long)ir + 4);
    uVar11._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar14 = -(uint)((0x604208U >> (uVar11 & 0x1f) & 1) != 0) & 0x80200;
  }
  emit_mrm(as,xVar13,uVar14 | dest,uVar8);
LAB_0013f070:
  ra_left(as,dest,local_3c);
  return;
}

Assistant:

static void asm_intarith(ASMState *as, IRIns *ir, x86Arith xa)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_GPR;
  Reg dest, right;
  int32_t k = 0;
  if (as->flagmcp == as->mcp) {  /* Drop test r,r instruction. */
    MCode *p = as->mcp + ((LJ_64 && *as->mcp < XI_TESTb) ? 3 : 2);
    if ((p[1] & 15) < 14) {
      if ((p[1] & 15) >= 12) p[1] -= 4;  /* L <->S, NL <-> NS */
      as->flagmcp = NULL;
      as->mcp = p;
    }  /* else: cannot transform LE/NLE to cc without use of OF. */
  }
  right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right) && !asm_isk32(as, rref, &k)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseloadm(as, rref, rset_clear(allow, dest), irt_is64(ir->t));
  }
  if (irt_isguard(ir->t))  /* For IR_ADDOV etc. */
    asm_guardcc(as, CC_O);
  if (xa != XOg_X_IMUL) {
    if (ra_hasreg(right))
      emit_mrm(as, XO_ARITH(xa), REX_64IR(ir, dest), right);
    else
      emit_gri(as, XG_ARITHi(xa), REX_64IR(ir, dest), k);
  } else if (ra_hasreg(right)) {  /* IMUL r, mrm. */
    emit_mrm(as, XO_IMUL, REX_64IR(ir, dest), right);
  } else {  /* IMUL r, r, k. */
    /* NYI: use lea/shl/add/sub (FOLD only does 2^k) depending on CPU. */
    Reg left = asm_fuseloadm(as, lref, RSET_GPR, irt_is64(ir->t));
    x86Op xo;
    if (checki8(k)) { emit_i8(as, k); xo = XO_IMULi8;
    } else { emit_i32(as, k); xo = XO_IMULi; }
    emit_mrm(as, xo, REX_64IR(ir, dest), left);
    return;
  }
  ra_left(as, dest, lref);
}